

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  int iVar2;
  UnifiedVectorFormat *pUVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  BoundFunctionExpression *pBVar15;
  pointer pFVar16;
  const_reference pvVar17;
  pointer pEVar18;
  reference vector;
  UnifiedVectorFormat *pUVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  ulong uVar22;
  VectorType VVar23;
  ulong uVar24;
  UnifiedVectorFormat *pUVar25;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar26;
  int iVar27;
  long lVar28;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long local_90;
  Vector *local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar15 + 0x198));
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar15 + 0x180),0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  uVar12 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar18 + 0x38));
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar15 + 0x180),0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar11 = duckdb::DecimalType::GetWidth((LogicalType *)(pEVar18 + 0x38));
  iVar1 = *(int *)(pFVar16 + 8);
  VVar23 = (VectorType)result;
  if ((int)((uVar12 & 0xff) - (uint)bVar11) < iVar1) {
    iVar2 = *(int *)(&NumericHelper::POWERS_OF_TEN + (int)((uVar12 & 0xff) - iVar1));
    iVar1 = *(int *)(&NumericHelper::POWERS_OF_TEN + -(long)iVar1);
    iVar27 = iVar2 / 2;
    vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
    pUVar3 = *(UnifiedVectorFormat **)(input + 0x18);
    if (*vector == (value_type)0x0) {
      duckdb::Vector::SetVectorType(VVar23);
      lVar28 = *(long *)(result + 0x20);
      lVar8 = *(long *)(vector + 0x20);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if (*(long *)(vector + 0x28) == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          pUVar26 = (UnifiedVectorFormat *)0x0;
          do {
            iVar14 = *(int *)(lVar8 + (long)pUVar26 * 4);
            iVar13 = iVar27;
            if (iVar14 < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(lVar28 + (long)pUVar26 * 4) = ((iVar13 + iVar14) / iVar2) * iVar1;
            pUVar26 = pUVar26 + 1;
          } while (pUVar3 != pUVar26);
        }
      }
      else {
        *(long *)(result + 0x28) = *(long *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
          lVar6 = *(long *)(vector + 0x28);
          uVar24 = 0;
          pUVar26 = (UnifiedVectorFormat *)0x0;
          do {
            if (lVar6 == 0) {
              pUVar19 = pUVar26 + 0x40;
              if (pUVar3 <= pUVar26 + 0x40) {
                pUVar19 = pUVar3;
              }
LAB_006bb994:
              pUVar25 = pUVar26;
              if (pUVar26 < pUVar19) {
                do {
                  iVar14 = *(int *)(lVar8 + (long)pUVar26 * 4);
                  iVar13 = iVar27;
                  if (iVar14 < 0) {
                    iVar13 = -iVar27;
                  }
                  *(int *)(lVar28 + (long)pUVar26 * 4) = ((iVar13 + iVar14) / iVar2) * iVar1;
                  pUVar26 = pUVar26 + 1;
                  pUVar25 = pUVar19;
                } while (pUVar19 != pUVar26);
              }
            }
            else {
              uVar7 = *(ulong *)(lVar6 + uVar24 * 8);
              pUVar19 = pUVar26 + 0x40;
              if (pUVar3 <= pUVar26 + 0x40) {
                pUVar19 = pUVar3;
              }
              pUVar25 = pUVar19;
              if (uVar7 != 0) {
                if (uVar7 == 0xffffffffffffffff) goto LAB_006bb994;
                pUVar25 = pUVar26;
                if (pUVar26 < pUVar19) {
                  uVar22 = 0;
                  do {
                    if ((uVar7 >> (uVar22 & 0x3f) & 1) != 0) {
                      iVar14 = *(int *)(lVar8 + (long)pUVar26 * 4 + uVar22 * 4);
                      iVar13 = iVar27;
                      if (iVar14 < 0) {
                        iVar13 = -iVar27;
                      }
                      *(int *)(lVar28 + (long)pUVar26 * 4 + uVar22 * 4) =
                           ((iVar13 + iVar14) / iVar2) * iVar1;
                    }
                    uVar22 = uVar22 + 1;
                    pUVar25 = pUVar19;
                  } while ((long)pUVar19 - (long)pUVar26 != uVar22);
                }
              }
            }
            uVar24 = uVar24 + 1;
            pUVar26 = pUVar25;
          } while (uVar24 != (ulong)(pUVar3 + 0x3f) >> 6);
        }
      }
    }
    else if (*vector == (value_type)0x2) {
      duckdb::Vector::SetVectorType(VVar23);
      piVar4 = *(int **)(result + 0x20);
      piVar5 = *(int **)(vector + 0x20);
      if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      iVar14 = -iVar27;
      if (-1 < *piVar5) {
        iVar14 = iVar27;
      }
      *piVar4 = ((iVar14 + *piVar5) / iVar2) * iVar1;
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
      duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar3);
      duckdb::Vector::SetVectorType(VVar23);
      lVar28 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (local_68 == 0) {
        if (pUVar3 != (UnifiedVectorFormat *)0x0) {
          lVar8 = *local_78;
          pUVar26 = (UnifiedVectorFormat *)0x0;
          do {
            pUVar19 = pUVar26;
            if (lVar8 != 0) {
              pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar26 * 4);
            }
            iVar14 = *(int *)(local_70 + (long)pUVar19 * 4);
            iVar13 = iVar27;
            if (iVar14 < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(lVar28 + (long)pUVar26 * 4) = ((iVar13 + iVar14) / iVar2) * iVar1;
            pUVar26 = pUVar26 + 1;
          } while (pUVar3 != pUVar26);
        }
      }
      else if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        lVar8 = *local_78;
        local_88 = result + 0x30;
        pUVar26 = (UnifiedVectorFormat *)0x0;
        local_90 = lVar28;
        do {
          pUVar19 = pUVar26;
          if (lVar8 != 0) {
            pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar26 * 4);
          }
          if ((*(ulong *)(local_68 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) & 1) == 0
             ) {
            _Var21._M_head_impl = *(unsigned_long **)(result + 0x28);
            if (_Var21._M_head_impl == (unsigned_long *)0x0) {
              local_80 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_a8,&local_80);
              p_Var10 = p_Stack_a0;
              uVar9 = local_a8;
              local_a8 = 0;
              p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = uVar9;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )local_88);
              _Var21._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              *(unsigned_long **)(result + 0x28) = _Var21._M_head_impl;
              lVar28 = local_90;
            }
            bVar11 = (byte)pUVar26 & 0x3f;
            _Var21._M_head_impl[(ulong)pUVar26 >> 6] =
                 _Var21._M_head_impl[(ulong)pUVar26 >> 6] &
                 (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          else {
            iVar14 = *(int *)(local_70 + (long)pUVar19 * 4);
            iVar13 = iVar27;
            if (iVar14 < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(lVar28 + (long)pUVar26 * 4) = ((iVar13 + iVar14) / iVar2) * iVar1;
          }
          pUVar26 = pUVar26 + 1;
        } while (pUVar3 != pUVar26);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
  }
  else {
    duckdb::Vector::SetVectorType(VVar23);
    duckdb::Value::INTEGER((int)&local_78);
    duckdb::Vector::SetValue((ulong)result,(Value *)0x0);
    duckdb::Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}